

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall Liby::http::HttpServer::handleReadEvent(HttpServer *this,Connection *conn)

{
  _Atomic_word *p_Var1;
  Buffer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  char *begin;
  char *pcVar9;
  off_t oVar10;
  ulong uVar11;
  Logger *this_01;
  mapped_type *pmVar12;
  undefined1 *in_RCX;
  ulong uVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int errcode;
  uint __len;
  char *in_R8;
  ulong __val;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  fdPtr fp;
  Reply rep;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_128;
  key_type local_118;
  Connection *local_f8;
  __weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *local_f0;
  RequestParser *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  FileDescriptor *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  undefined1 local_a0 [32];
  off_t oStack_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_78;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  HttpServer *local_38;
  
  peVar3 = (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_38 = this;
  if (peVar3 == (element_type *)0x0) {
    __assert_fail("conn.context_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp"
                  ,0x1d,"void Liby::http::HttpServer::handleReadEvent(Connection &)");
  }
  this_00 = &conn->readBuf_;
  local_e8 = (RequestParser *)(peVar3 + 2);
  local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar3 + 3);
  local_f0 = (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>;
  local_40 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)(peVar3 + 0xb);
  local_f8 = conn;
  do {
    bVar7 = Buffer::empty(this_00);
    if (bVar7) {
      return;
    }
    iVar8 = *(int *)((long)&peVar3[0x16]._vptr_BaseContext + 4);
    begin = Buffer::data(this_00);
    pcVar9 = Buffer::data(this_00);
    oVar10 = Buffer::size(this_00);
    RequestParser::parse(local_e8,begin,pcVar9 + oVar10);
    Buffer::retrieve(this_00,(long)*(int *)((long)&peVar3[0x16]._vptr_BaseContext + 4) - (long)iVar8
                    );
    iVar8 = (int)in_R8;
    if (5 < *(int *)&peVar3[0x16]._vptr_BaseContext) {
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_a0,local_f0);
      uVar5 = local_a0._8_8_;
      uVar4 = CONCAT44(local_a0._4_4_,local_a0._0_4_);
      errcode = extraout_EDX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_a0._8_8_ + 0xc) = *(_Atomic_word *)(local_a0._8_8_ + 0xc) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001189dc;
        }
        else {
          *(_Atomic_word *)(local_a0._8_8_ + 0xc) = *(_Atomic_word *)(local_a0._8_8_ + 0xc) + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        errcode = extraout_EDX_00;
      }
LAB_001189dc:
      Reply::Error_abi_cxx11_((string *)local_a0,(Reply *)0x194,errcode);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar5 + 0xc) = *(_Atomic_word *)(uVar5 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar5 + 0xc) = *(_Atomic_word *)(uVar5 + 0xc) + 1;
        }
      }
      local_138._0_8_ = 0;
      local_138._8_8_ = 0;
      local_148._0_8_ = (pointer)0x0;
      local_148._8_8_ = 0;
      local_148._0_8_ = operator_new(0x10);
      *(undefined8 *)local_148._0_8_ = uVar4;
      *(undefined8 *)(local_148._0_8_ + 8) = uVar5;
      local_138._8_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
           ::_M_invoke;
      local_138._0_8_ =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:45:42)>
           ::_M_manager;
      Connection::send(local_f8,(int)local_a0,local_148,(size_t)in_RCX,iVar8);
      if ((code *)local_138._0_8_ != (code *)0x0) {
        (*(code *)local_138._0_8_)(local_148,local_148,3);
      }
      if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(uVar5 + 0xc);
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = *(_Atomic_word *)(uVar5 + 0xc);
        *(int *)(uVar5 + 0xc) = iVar8 + -1;
      }
      if (iVar8 != 1) {
        return;
      }
      (*(*(_func_int ***)uVar5)[3])(uVar5);
      return;
    }
    if (*(int *)&peVar3[0x16]._vptr_BaseContext != 5) {
      return;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_38->root_,local_e0);
    FileDescriptor::openFile
              ((FileDescriptor *)&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_));
    }
    if (local_d8 == (FileDescriptor *)0x0) {
      this_01 = Logger::getLogger();
      bVar7 = false;
      in_RCX = (undefined1 *)0x38;
      in_R8 = "handleReadEvent";
      Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    }
    else {
      uVar11 = FileDescriptor::getFileSize(local_d8);
      local_a0._24_8_ = 0;
      oStack_80 = 0;
      local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a0._16_8_ = 0;
      local_78._M_buckets = &local_78._M_single_bucket;
      local_78._M_bucket_count = 1;
      local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_78._M_element_count = 0;
      local_78._M_rehash_policy._M_max_load_factor = 1.0;
      local_78._M_rehash_policy._M_next_resize = 0;
      local_78._M_single_bucket = (__node_base_ptr)0x0;
      local_a0._0_4_ = 200;
      __val = -uVar11;
      if (0 < (long)uVar11) {
        __val = uVar11;
      }
      __len = 1;
      if (9 < __val) {
        uVar13 = __val;
        uVar6 = 4;
        do {
          __len = uVar6;
          if (uVar13 < 100) {
            __len = __len - 2;
            goto LAB_001185dd;
          }
          if (uVar13 < 1000) {
            __len = __len - 1;
            goto LAB_001185dd;
          }
          if (uVar13 < 10000) goto LAB_001185dd;
          bVar7 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          uVar6 = __len + 4;
        } while (bVar7);
        __len = __len + 1;
      }
LAB_001185dd:
      local_148._0_8_ = local_138;
      std::__cxx11::string::_M_construct
                ((ulong)local_148,(char)__len - (char)((long)uVar11 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_148._0_8_ + -((long)uVar11 >> 0x3f)),__len,__val);
      paVar2 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Content-Length","");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_78,&local_118);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      getMimeType((string *)local_148,local_e0);
      local_118._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Content-Type","");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_78,&local_118);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_148,local_f0);
      uVar5 = local_148._8_8_;
      uVar4 = local_148._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_148._8_8_ + 0xc) = *(_Atomic_word *)(local_148._8_8_ + 0xc) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0011872a;
        }
        else {
          *(_Atomic_word *)(local_148._8_8_ + 0xc) = *(_Atomic_word *)(local_148._8_8_ + 0xc) + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
      }
LAB_0011872a:
      Reply::toString_abi_cxx11_(&local_118,(Reply *)local_a0);
      local_148._0_8_ = local_d8;
      local_148._8_8_ = local_d0;
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_d0->_M_use_count = local_d0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_d0->_M_use_count = local_d0->_M_use_count + 1;
        }
      }
      local_138._0_8_ = uVar4;
      local_138._8_8_ = uVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar5 + 0xc) = *(_Atomic_word *)(uVar5 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar5 + 0xc) = *(_Atomic_word *)(uVar5 + 0xc) + 1;
        }
      }
      local_c8 = (undefined8 *)0x0;
      uStack_c0 = 0;
      local_b8 = (code *)0x0;
      pcStack_b0 = (code *)0x0;
      local_128 = uVar11;
      local_c8 = (undefined8 *)operator_new(0x28);
      uVar4 = local_148._8_8_;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *local_c8 = local_148._0_8_;
      local_c8[1] = uVar4;
      local_148._0_8_ = (pointer)0x0;
      local_c8[2] = local_138._0_8_;
      local_c8[3] = local_138._8_8_;
      in_RCX = local_138;
      local_138._0_8_ = 0;
      local_138._8_8_ = 0;
      local_c8[4] = uVar11;
      pcStack_b0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                   ::_M_invoke;
      local_b8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:76:39)>
                 ::_M_manager;
      Connection::send(local_f8,(int)&local_118,&local_c8,(size_t)in_RCX,(int)in_R8);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_148._0_8_ = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Connection","");
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_40,(key_type *)local_148);
      iVar8 = std::__cxx11::string::compare((char *)pmVar12);
      bVar7 = iVar8 == 0;
      if ((undefined1 *)local_148._0_8_ != local_138) {
        operator_delete((void *)local_148._0_8_);
      }
      if (iVar8 == 0) {
        RequestParser::clear(local_e8);
      }
      else {
        *(undefined1 *)&peVar3[1]._vptr_BaseContext = 0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(uVar5 + 0xc);
          iVar8 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar8 = *(_Atomic_word *)(uVar5 + 0xc);
          in_RCX = (undefined1 *)(ulong)(iVar8 - 1U);
          *(uint *)(uVar5 + 0xc) = iVar8 - 1U;
        }
        if (iVar8 == 1) {
          (*(*(_func_int ***)uVar5)[3])(uVar5);
        }
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_78);
      Buffer::~Buffer((Buffer *)(local_a0 + 8));
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    if (!bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void HttpServer::handleReadEvent(Connection &conn) {
    assert(conn.context_);

    HttpContext *context = static_cast<HttpContext *>(conn.context_.get());

    while (1) {
        Buffer &readBuf = conn.read();
        if (readBuf.empty())
            return;

        int savedBytes = context->requestParser.bytes_;
        context->requestParser.parse(readBuf.data(),
                                     readBuf.data() + readBuf.size());
        readBuf.retrieve(context->requestParser.bytes_ - savedBytes);

        if (context->requestParser.isError()) {
            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(Reply::Error(404), [weak_conn] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->destroy();
                }
            });
            break;
        } else if (context->requestParser.isGood()) {
            auto fp =
                FileDescriptor::openFile(root_ + context->requestParser.uri_);
            if (!fp) {
                error("fp is null");
                return;
            }

            long filesize;
            try {
                filesize = fp->getFileSize();
            } catch (const char *err) {
                error("%s", err);
                // send error response
                break;
            }

            Reply rep;
            rep.status_ = HTTP_OK;
            rep.headers_["Content-Length"] = std::to_string(filesize);
            rep.headers_["Content-Type"] =
                getMimeType(context->requestParser.uri_);

            std::weak_ptr<Connection> weak_conn(conn.shared_from_this());
            conn.send(rep.toString(), [fp, weak_conn, filesize] {
                if (!weak_conn.expired()) {
                    auto conn = weak_conn.lock();
                    conn->sendFile(fp, 0, filesize, [conn] {
                        HttpContext *context =
                            static_cast<HttpContext *>(conn->context_.get());
                        if (!context->keep_alive_)
                            conn->destroyLater();
                    });
                }
            });
            if (context->requestParser.headers_["Connection"] != "keep-alive") {
                context->keep_alive_ = false;
                break;
            }
            context->requestParser.clear();
        } else {
            break;
        }
    }
}